

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O0

int av1_alloc_internal_frame_buffers(InternalFrameBufferList *list)

{
  InternalFrameBuffer *pIVar1;
  InternalFrameBufferList *in_RDI;
  bool bVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  av1_free_internal_frame_buffers(in_RDI);
  in_RDI->num_internal_frame_buffers = 0x10;
  pIVar1 = (InternalFrameBuffer *)
           aom_calloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(size_t)in_RDI);
  in_RDI->int_fb = pIVar1;
  bVar2 = in_RDI->int_fb == (InternalFrameBuffer *)0x0;
  if (bVar2) {
    in_RDI->num_internal_frame_buffers = 0;
  }
  return (uint)bVar2;
}

Assistant:

int av1_alloc_internal_frame_buffers(InternalFrameBufferList *list) {
  assert(list != NULL);
  av1_free_internal_frame_buffers(list);

  list->num_internal_frame_buffers =
      AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS;
  list->int_fb = (InternalFrameBuffer *)aom_calloc(
      list->num_internal_frame_buffers, sizeof(*list->int_fb));
  if (list->int_fb == NULL) {
    list->num_internal_frame_buffers = 0;
    return 1;
  }
  return 0;
}